

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

char * sam_hdr_find_line(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SAM_hdr_type *pSVar4;
  SAM_hdr_tag *pSVar5;
  kstring_t ks;
  
  pSVar4 = sam_hdr_find(hdr,type,ID_key,ID_value);
  ks.l = 0;
  ks.m = 0;
  ks.s = (char *)0x0;
  if (pSVar4 != (SAM_hdr_type *)0x0) {
    iVar2 = kputc_(0x40,&ks);
    iVar3 = kputs(type,&ks);
    bVar1 = iVar3 == -1 || iVar2 == -1;
    pSVar5 = (SAM_hdr_tag *)&pSVar4->tag;
    while (pSVar5 = pSVar5->next, pSVar5 != (SAM_hdr_tag *)0x0) {
      iVar2 = kputc_(9,&ks);
      iVar3 = kputsn(pSVar5->str,pSVar5->len,&ks);
      bVar1 = (bool)(bVar1 | (iVar3 == -1 || iVar2 == -1));
    }
    if (!bVar1) {
      return ks.s;
    }
    free(ks.s);
  }
  return (char *)0x0;
}

Assistant:

char *sam_hdr_find_line(SAM_hdr *hdr, char *type,
			char *ID_key, char *ID_value) {
    SAM_hdr_type *ty = sam_hdr_find(hdr, type, ID_key, ID_value);
    kstring_t ks = KS_INITIALIZER;
    SAM_hdr_tag *tag;
    int r = 0;

    if (!ty)
	return NULL;

    // Paste together the line from the hashed copy
    r |= (kputc_('@', &ks) == EOF);
    r |= (kputs(type, &ks) == EOF);
    for (tag = ty->tag; tag; tag = tag->next) {
	r |= (kputc_('\t', &ks) == EOF);
	r |= (kputsn(tag->str, tag->len, &ks) == EOF);
    }

    if (r) {
	KS_FREE(&ks);
	return NULL;
    }

    return ks_str(&ks);
}